

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O2

TestStatus *
vkt::pipeline::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef_conflict1 *caseDef)

{
  undefined8 *puVar1;
  VkImageViewType VVar2;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  deUint64 dVar4;
  undefined8 uVar5;
  TestLog *log;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  VkImageSubresourceRange subresourceRange;
  IVec3 renderSize;
  IVec3 *allocator;
  pointer vertexModule;
  Handle<(vk::HandleType)17> renderPass;
  Handle<(vk::HandleType)14> fragmentModule;
  Handle<(vk::HandleType)16> pipelineLayout;
  deUint32 dVar6;
  int iVar7;
  VkResult result;
  DeviceInterface *vk;
  VkDevice pVVar8;
  VkQueue queue;
  TextureFormat format_00;
  ProgramBinary *pPVar9;
  Unique<vk::Handle<(vk::HandleType)13>_> *ptr;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar10;
  VkImageCreateFlags VVar11;
  uint uVar12;
  deUint32 layerNdx;
  int iVar13;
  ulong uVar14;
  int y;
  deUint32 dVar15;
  int iVar16;
  long lVar17;
  int z;
  size_t bufferSize;
  int x;
  int iVar18;
  bool bVar19;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 uVar20;
  undefined4 in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 uVar21;
  undefined4 in_stack_fffffffffffffb94;
  VkImageUsageFlags in_stack_fffffffffffffb98;
  undefined1 multisample;
  undefined4 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffbb8;
  VkImageViewType local_434;
  VkDeviceSize vertexBufferOffset;
  undefined8 uStack_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  undefined4 uStack_408;
  undefined4 uStack_404;
  uint local_400;
  undefined4 uStack_3fc;
  undefined4 local_3f8;
  int iStack_3f4;
  undefined8 uStack_3f0;
  deUint32 local_3e8;
  IVec3 *local_3d8;
  allocator<char> local_3c9;
  IVec3 *local_3c8;
  VkDevice local_3c0;
  TextureLevel textureLevel;
  RefBase<vk::VkCommandBuffer_s_*> local_328;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  attachmentDescriptions;
  Move<vk::Handle<(vk::HandleType)9>_> colorImage;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  Move<vk::Handle<(vk::HandleType)9>_> msColorImage;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferAlloc;
  VkImageSubresourceRange res;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachmentHandles;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  colorAttachments;
  TextureFormat format;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> msColorImageAlloc;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorImageAlloc;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_148;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_128;
  VkClearColorValue clearColor;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_e8;
  Vector<int,_3> local_c4;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_b8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_98;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_78;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_50;
  
  vk = Context::getDeviceInterface(context);
  pVVar8 = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  dVar6 = Context::getUniversalQueueFamilyIndex(context);
  local_3c8 = (IVec3 *)Context::getDefaultAllocator(context);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  msColorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)0x0;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  iVar13 = (caseDef->attachmentSize).m_data[1];
  iVar16 = (caseDef->attachmentSize).m_data[0];
  iVar18 = (caseDef->attachmentSize).m_data[2];
  dVar15 = caseDef->numLayers;
  format_00 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar7 = tcu::getPixelSize(format_00);
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&textureLevel,vk,pVVar8,
             (ulong)(iVar13 * iVar16 * iVar18 * dVar15 * iVar7),2);
  local_128.m_data.deleter.m_device = (VkDevice)textureLevel._16_8_;
  local_128.m_data.object.m_internal._0_4_ = textureLevel.m_format.order;
  local_128.m_data.object.m_internal._4_4_ = textureLevel.m_format.type;
  local_128.m_data.deleter.m_deviceIface = (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr._0_4_ = 0;
  textureLevel.m_data.m_ptr._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&textureLevel);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel,vk,pVVar8
             ,(Allocator *)local_3c8,(VkBuffer)local_128.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)textureLevel.m_format;
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
       = (Allocation *)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  colorAttachments.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentHandles.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&textureLevel,vk,pVVar8);
  local_78.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
  local_78.m_data.deleter.m_device = (VkDevice)textureLevel._16_8_;
  local_78.m_data.object.m_internal._0_4_ = textureLevel.m_format.order;
  local_78.m_data.object.m_internal._4_4_ = textureLevel.m_format.type;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr._0_4_ = 0;
  textureLevel.m_data.m_ptr._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&textureLevel);
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar12 = caseDef->numLayers;
  uVar14 = (ulong)uVar12;
  bVar19 = caseDef->multisample;
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            (&attachmentDescriptions,uVar14,(allocator_type *)&textureLevel);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             &framebuffer,uVar14,(allocator_type *)&textureLevel);
  local_3d8 = &caseDef->attachmentSize;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar17 = 0; uVar14 * 0x24 - lVar17 != 0; lVar17 = lVar17 + 0x24) {
    *(undefined8 *)
     ((long)&(attachmentDescriptions.
              super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
              ._M_impl.super__Vector_impl_data._M_start)->flags + lVar17) = 0x2500000000;
    *(uint *)((long)&(attachmentDescriptions.
                      super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start)->samples + lVar17) =
         (uint)bVar19 * 3 + 1;
    puVar1 = (undefined8 *)
             ((long)&(attachmentDescriptions.
                      super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start)->loadOp + lVar17);
    *puVar1 = 0;
    puVar1[1] = 0x100000002;
    *(undefined8 *)
     ((long)&(attachmentDescriptions.
              super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
              ._M_impl.super__Vector_impl_data._M_start)->initialLayout + lVar17) = 0x200000001;
  }
  iVar13 = 0;
  local_3c0 = pVVar8;
  for (lVar17 = 0; pVVar8 = local_3c0, uVar14 * 8 - lVar17 != 0; lVar17 = lVar17 + 8) {
    textureLevel.m_data.m_cap =
         framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal +
         lVar17;
    *(int *)(framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal +
            lVar17) = iVar13;
    *(undefined4 *)
     (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal + 4 +
     lVar17) = 2;
    textureLevel.m_size.m_data[2] = 0;
    textureLevel._20_4_ = 0;
    textureLevel.m_data.m_ptr._4_4_ = 0;
    textureLevel.m_format.order = R;
    textureLevel.m_format.type = SNORM_INT8;
    textureLevel.m_size.m_data[0] = 0;
    textureLevel.m_size.m_data[1] = 0;
    textureLevel.m_data.m_ptr._0_4_ = 1;
    std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::push_back
              (&subpasses,(value_type *)&textureLevel);
    iVar13 = iVar13 + 1;
  }
  textureLevel.m_format.order = 0x26;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel._16_8_ = (ulong)uVar12 << 0x20;
  textureLevel.m_data.m_ptr._0_4_ =
       (int)attachmentDescriptions.
            super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
            ._M_impl.super__Vector_impl_data._M_start;
  textureLevel.m_data.m_ptr._4_4_ =
       (undefined4)
       ((ulong)attachmentDescriptions.
               super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  textureLevel.m_data.m_cap._0_4_ =
       (undefined4)
       (((long)subpasses.
               super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)subpasses.
              super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertexBufferOffset,vk,local_3c0,
             (VkRenderPassCreateInfo *)&textureLevel,(VkAllocationCallbacks *)0x0);
  std::_Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::
  ~_Vector_base(&subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
               );
  std::_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
  ~_Vector_base((_Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                 *)&framebuffer);
  std::_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  ~_Vector_base(&attachmentDescriptions.
                 super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
               );
  local_148.m_data.object.m_internal = vertexBufferOffset;
  local_148.m_data.deleter.m_deviceIface = uStack_420;
  local_148.m_data.deleter.m_device = (VkDevice)local_418._M_allocated_capacity;
  vertexBufferOffset = 0;
  uStack_420 = (DeviceInterface *)0x0;
  local_418._M_allocated_capacity = 0;
  local_418._8_4_ = 0;
  local_418._12_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&vertexBufferOffset);
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  pPVar3 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexBufferOffset,"vert",(allocator<char> *)&attachmentDescriptions);
  allocator = local_3c8;
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&vertexBufferOffset);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&textureLevel,vk,pVVar8,pPVar9,0);
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)textureLevel._16_8_;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)textureLevel.m_format;
  subpasses.super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)textureLevel.m_size.m_data._0_8_;
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr._0_4_ = 0;
  textureLevel.m_data.m_ptr._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&textureLevel);
  std::__cxx11::string::~string((string *)&vertexBufferOffset);
  pPVar3 = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexBufferOffset,"frag",(allocator<char> *)&attachmentDescriptions);
  pPVar9 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,(string *)&vertexBufferOffset);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&textureLevel,vk,pVVar8,pPVar9,0);
  local_98.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
  local_98.m_data.deleter.m_device = (VkDevice)textureLevel._16_8_;
  local_98.m_data.object.m_internal._0_4_ = textureLevel.m_format.order;
  local_98.m_data.object.m_internal._4_4_ = textureLevel.m_format.type;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr._0_4_ = 0;
  textureLevel.m_data.m_ptr._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&textureLevel);
  std::__cxx11::string::~string((string *)&vertexBufferOffset);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&textureLevel,vk,pVVar8,2,dVar6,
             (VkAllocationCallbacks *)0x0);
  local_b8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
  local_b8.m_data.deleter.m_device = (VkDevice)textureLevel._16_8_;
  local_b8.m_data.object.m_internal._0_4_ = textureLevel.m_format.order;
  local_b8.m_data.object.m_internal._4_4_ = textureLevel.m_format.type;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr._0_4_ = 0;
  textureLevel.m_data.m_ptr._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&textureLevel);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&textureLevel,vk,pVVar8,
                    (VkCommandPool)local_b8.m_data.object.m_internal);
  local_328.m_data.deleter.m_pool.m_internal =
       CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
  local_328.m_data.deleter.m_device = (VkDevice)textureLevel._16_8_;
  local_328.m_data.object = (VkCommandBuffer_s *)textureLevel.m_format;
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0;
  textureLevel.m_data.m_ptr._0_4_ = 0;
  textureLevel.m_data.m_ptr._4_4_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&textureLevel);
  VVar2 = caseDef->imageType;
  local_434 = VK_IMAGE_VIEW_TYPE_2D;
  if ((VVar2 != VK_IMAGE_VIEW_TYPE_CUBE) && (VVar2 != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)) {
    local_434 = VVar2;
  }
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar15 = 0;
  if (0 < (int)caseDef->numLayers) {
    dVar15 = caseDef->numLayers;
  }
  while( true ) {
    pVVar8 = local_3c0;
    multisample = (undefined1)in_stack_fffffffffffffba0;
    bVar19 = dVar15 == 0;
    dVar15 = dVar15 - 1;
    if (bVar19) break;
    textureLevel.m_format.order = 0xbf800000;
    textureLevel.m_format.type = 0xbf800000;
    textureLevel.m_size.m_data[0] = 0;
    textureLevel.m_size.m_data[1] = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
               &attachmentDescriptions,(Vector<float,_4> *)&textureLevel);
    textureLevel.m_format.order = 0xbf800000;
    textureLevel.m_format.type = 0x3f800000;
    textureLevel.m_size.m_data[0] = 0;
    textureLevel.m_size.m_data[1] = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
               &attachmentDescriptions,(Vector<float,_4> *)&textureLevel);
    textureLevel.m_format.order = 0x3f800000;
    textureLevel.m_format.type = 0xbf800000;
    textureLevel.m_size.m_data[0] = 0;
    textureLevel.m_size.m_data[1] = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
               &attachmentDescriptions,(Vector<float,_4> *)&textureLevel);
    textureLevel.m_format = (TextureFormat)&DAT_3f8000003f800000;
    textureLevel.m_size.m_data[0] = 0;
    textureLevel.m_size.m_data[1] = 0x3f800000;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)
               &attachmentDescriptions,(Vector<float,_4> *)&textureLevel);
  }
  bufferSize = (long)attachmentDescriptions.
                     super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)attachmentDescriptions.
                     super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  makeBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,vk,local_3c0,bufferSize,
             0x80);
  textureLevel._16_8_ = local_418._M_allocated_capacity;
  textureLevel.m_data.m_ptr._0_4_ = local_418._8_4_;
  textureLevel.m_data.m_ptr._4_4_ = local_418._12_4_;
  textureLevel.m_format.order = (undefined4)vertexBufferOffset;
  textureLevel.m_format.type = vertexBufferOffset._4_4_;
  textureLevel.m_size.m_data._0_8_ = uStack_420;
  vertexBufferOffset = 0;
  uStack_420 = (DeviceInterface *)0x0;
  local_418._M_allocated_capacity = 0;
  local_418._8_4_ = 0;
  local_418._12_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)textureLevel._16_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
       textureLevel.m_format.order;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_ =
       textureLevel.m_format.type;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset);
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel,vk,pVVar8
             ,(Allocator *)allocator,
             (VkBuffer)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  data.ptr._4_4_ = in_stack_fffffffffffffb8c;
  data.ptr._0_4_ = in_stack_fffffffffffffb88;
  data._8_4_ = in_stack_fffffffffffffb90;
  data._12_4_ = in_stack_fffffffffffffb94;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel);
  memcpy((vertexBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
          m_data.ptr)->m_hostPtr,
         attachmentDescriptions.
         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,pVVar8,
             (VkDeviceMemory)
             ((vertexBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &attachmentDescriptions);
  if ((ulong)caseDef->imageType < 7) {
    VVar11 = *(VkImageCreateFlags *)(&DAT_0095e0b0 + (ulong)caseDef->imageType * 4);
  }
  else {
    VVar11 = 3;
  }
  uVar21 = 0;
  uVar20 = 0x13;
  makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset,vk,pVVar8,VVar11,
            (VkImageType)local_3d8,caseDef->numLayers,
            (IVec3 *)CONCAT44(in_stack_fffffffffffffb8c,0x13),0,in_stack_fffffffffffffb98,
            (bool)multisample);
  textureLevel._16_8_ = local_418._M_allocated_capacity;
  textureLevel.m_data.m_ptr._0_4_ = local_418._8_4_;
  textureLevel.m_data.m_ptr._4_4_ = local_418._12_4_;
  textureLevel.m_format.order = (undefined4)vertexBufferOffset;
  textureLevel.m_format.type = vertexBufferOffset._4_4_;
  textureLevel.m_size.m_data._0_8_ = uStack_420;
  vertexBufferOffset = 0;
  uStack_420 = (DeviceInterface *)0x0;
  local_418._M_allocated_capacity = 0;
  local_418._8_4_ = 0;
  local_418._12_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
            (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)textureLevel._16_8_;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._0_4_ =
       textureLevel.m_format.order;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._4_4_ =
       textureLevel.m_format.type;
  colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset);
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel,vk,pVVar8,
            (Allocator *)allocator,
            (VkImage)colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                     m_internal,(MemoryRequirement)0x0);
  textureLevel.m_format.order = R;
  textureLevel.m_format.type = SNORM_INT8;
  data_00.ptr._4_4_ = in_stack_fffffffffffffb8c;
  data_00.ptr._0_4_ = uVar20;
  data_00._8_4_ = uVar21;
  data_00._12_4_ = in_stack_fffffffffffffb94;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
             data_00);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel);
  if (caseDef->multisample == true) {
    if ((ulong)caseDef->imageType < 7) {
      VVar11 = *(VkImageCreateFlags *)(&DAT_0095e0b0 + (ulong)caseDef->imageType * 4);
    }
    else {
      VVar11 = 3;
    }
    uVar21 = 1;
    uVar20 = 0x13;
    makeImage((Move<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset,vk,pVVar8,VVar11,
              (VkImageType)local_3d8,caseDef->numLayers,
              (IVec3 *)CONCAT44(in_stack_fffffffffffffb8c,0x13),1,in_stack_fffffffffffffb98,
              (bool)multisample);
    textureLevel._16_8_ = local_418._M_allocated_capacity;
    textureLevel.m_data.m_ptr._0_4_ = local_418._8_4_;
    textureLevel.m_data.m_ptr._4_4_ = local_418._12_4_;
    textureLevel.m_format.order = (undefined4)vertexBufferOffset;
    textureLevel.m_format.type = vertexBufferOffset._4_4_;
    textureLevel.m_size.m_data._0_8_ = uStack_420;
    vertexBufferOffset = 0;
    uStack_420 = (DeviceInterface *)0x0;
    local_418._M_allocated_capacity = 0;
    local_418._8_4_ = 0;
    local_418._12_4_ = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
              (&msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)textureLevel._16_8_;
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._0_4_ =
         textureLevel.m_format.order;
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal._4_4_ =
         textureLevel.m_format.type;
    msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)9>_> *)&vertexBufferOffset);
    bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel,vk,
              pVVar8,(Allocator *)allocator,
              (VkImage)msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal,(MemoryRequirement)0x0);
    textureLevel.m_format.order = R;
    textureLevel.m_format.type = SNORM_INT8;
    data_01.ptr._4_4_ = in_stack_fffffffffffffb8c;
    data_01.ptr._0_4_ = uVar20;
    data_01._8_4_ = uVar21;
    data_01._12_4_ = in_stack_fffffffffffffb94;
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
              (&msColorImageAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data_01);
    de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
              ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&textureLevel);
  }
  local_3c8 = &caseDef->renderSize;
  uVar12 = 0;
  while (uVar12 < caseDef->numLayers) {
    pMVar10 = &colorImage;
    if (caseDef->multisample != false) {
      pMVar10 = &msColorImage;
    }
    local_3d8 = (IVec3 *)CONCAT44(local_3d8._4_4_,uVar12);
    subresourceRange.levelCount = 1;
    subresourceRange.aspectMask = 1;
    subresourceRange.baseMipLevel = 0;
    subresourceRange.baseArrayLayer = uVar12;
    subresourceRange.layerCount = 1;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_e8,vk,pVVar8,
                  (VkImage)(pMVar10->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                           m_internal,local_434,VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
    ptr = (Unique<vk::Handle<(vk::HandleType)13>_> *)operator_new(0x20);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_device =
         local_e8.m_data.deleter.m_device;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_allocator =
         local_e8.m_data.deleter.m_allocator;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         local_e8.m_data.object.m_internal;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.deleter.m_deviceIface =
         local_e8.m_data.deleter.m_deviceIface;
    local_e8.m_data.object.m_internal = 0;
    local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    local_e8.m_data.deleter.m_device = (VkDevice)0x0;
    local_e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&textureLevel,
               ptr);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>>>>>
                *)&colorAttachments,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&textureLevel)
    ;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&textureLevel)
    ;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_e8);
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    push_back(&attachmentHandles,
              (value_type *)
              colorAttachments.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
    pipelineLayout.m_internal = local_78.m_data.object.m_internal;
    fragmentModule.m_internal = local_98.m_data.object.m_internal;
    renderPass.m_internal = local_148.m_data.object.m_internal;
    vertexModule = subpasses.
                   super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    tcu::Vector<int,_3>::Vector(&local_c4,local_3c8);
    renderSize.m_data[2] = 4;
    renderSize.m_data._0_8_ = &local_c4;
    makeGraphicsPipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_50,vk,local_3c0,
               (VkPipelineLayout)pipelineLayout.m_internal,(VkRenderPass)renderPass.m_internal,
               (VkShaderModule)vertexModule,(VkShaderModule)fragmentModule.m_internal,renderSize,
               (VkPrimitiveTopology)local_3d8,1,caseDef->multisample,(bool)in_stack_fffffffffffffbb8
              );
    pipeline::(anonymous_namespace)::makeSharedPtr<vk::Handle<(vk::HandleType)18>>
              ((_anonymous_namespace_ *)&textureLevel,
               (Move<vk::Handle<(vk::HandleType)18>_> *)&local_50);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                *)&pipeline,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)&textureLevel)
    ;
    pVVar8 = local_3c0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)&textureLevel)
    ;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_50);
    uVar12 = (VkPrimitiveTopology)local_3d8 + 1;
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,vk,pVVar8,
                  (VkRenderPass)local_148.m_data.object.m_internal,caseDef->numLayers,
                  attachmentHandles.
                  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,(caseDef->renderSize).m_data[0],
                  (caseDef->renderSize).m_data[1],1);
  textureLevel._16_8_ = local_418._M_allocated_capacity;
  textureLevel.m_data.m_ptr._0_4_ = local_418._8_4_;
  textureLevel.m_data.m_ptr._4_4_ = local_418._12_4_;
  textureLevel.m_format.order = (undefined4)vertexBufferOffset;
  textureLevel.m_format.type = vertexBufferOffset._4_4_;
  textureLevel.m_size.m_data._0_8_ = uStack_420;
  vertexBufferOffset = 0;
  uStack_420 = (DeviceInterface *)0x0;
  local_418._M_allocated_capacity = 0;
  local_418._8_4_ = 0;
  local_418._12_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(textureLevel.m_data.m_ptr._4_4_,(int)textureLevel.m_data.m_ptr);
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)textureLevel._16_8_;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal._0_4_ =
       textureLevel.m_format.order;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal._4_4_ =
       textureLevel.m_format.type;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)textureLevel.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset);
  beginCommandBuffer(vk,local_328.m_data.object);
  textureLevel.m_format.order = 0x2d;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0;
  textureLevel._20_4_ = 0x1000;
  textureLevel.m_data.m_ptr._0_4_ = 0;
  textureLevel.m_data.m_ptr._4_4_ = 7;
  textureLevel.m_data.m_cap._0_4_ = 0xffffffff;
  textureLevel.m_data.m_cap._4_4_ = 0xffffffff;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_328.m_data.object,1,0x8000,0,0,0,0,0,1,&textureLevel);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(attachmentDescriptions.
                         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,caseDef->numLayers
                        );
  clearColor.float32[0] = 0.0;
  clearColor.float32[1] = 0.0;
  clearColor.float32[2] = 0.0;
  clearColor.int32[3] = 0x3f800000;
  pMVar10 = &colorImage;
  if (caseDef->multisample != false) {
    pMVar10 = &msColorImage;
  }
  (*vk->_vptr_DeviceInterface[0x66])
            (vk,local_328.m_data.object,
             (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal,7,
             &clearColor,1,(int)&attachmentDescriptions);
  vertexBufferOffset = CONCAT44(vertexBufferOffset._4_4_,0x2d);
  uStack_420 = (DeviceInterface *)0x0;
  local_418._M_allocated_capacity = 0x8000001000;
  local_418._8_4_ = 7;
  local_418._12_4_ = 1;
  uStack_408 = 0xffffffff;
  uStack_404 = 0xffffffff;
  pMVar10 = &colorImage;
  if (caseDef->multisample != false) {
    pMVar10 = &msColorImage;
  }
  dVar4 = (pMVar10->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  local_400 = (uint)dVar4;
  uStack_3fc = (undefined4)(dVar4 >> 0x20);
  local_3e8 = caseDef->numLayers;
  local_3f8 = 1;
  iStack_3f4 = 0;
  uStack_3f0 = 1;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_328.m_data.object,0x1000,0x80,0,0,0,0,0,1,
             (RefBase<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset);
  textureLevel.m_format.order = 0x2b;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel._16_8_ = local_148.m_data.object.m_internal;
  textureLevel.m_data.m_ptr._0_4_ =
       (int)framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  textureLevel.m_data.m_ptr._4_4_ =
       (undefined4)
       (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal >> 0x20)
  ;
  textureLevel.m_data.m_cap._0_4_ = 0;
  textureLevel.m_data.m_cap._4_4_ = 0;
  vertexBufferOffset = 0;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_328.m_data.object,&textureLevel,0);
  (*vk->_vptr_DeviceInterface[0x58])
            (vk,local_328.m_data.object,0,1,&vertexBuffer,&vertexBufferOffset);
  lVar17 = 0;
  for (uVar14 = 0; uVar14 < caseDef->numLayers; uVar14 = uVar14 + 1) {
    if (lVar17 != 0) {
      (*vk->_vptr_DeviceInterface[0x75])(vk,local_328.m_data.object,0);
    }
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,local_328.m_data.object,0,
               **(undefined8 **)
                 ((long)&(pipeline.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17 * 4));
    (*vk->_vptr_DeviceInterface[0x59])(vk,local_328.m_data.object,4,1);
    lVar17 = lVar17 + 4;
  }
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_328.m_data.object);
  if (caseDef->multisample == true) {
    textureLevel.m_format.order = 0x2d;
    textureLevel.m_size.m_data[0] = 0;
    textureLevel.m_size.m_data[1] = 0;
    textureLevel.m_size.m_data[2] = 0x100;
    textureLevel._20_4_ = 0x800;
    textureLevel.m_data.m_ptr._0_4_ = 2;
    textureLevel.m_data.m_ptr._4_4_ = 1;
    textureLevel.m_data.m_cap._0_4_ = 0xffffffff;
    textureLevel.m_data.m_cap._4_4_ = 0xffffffff;
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,local_328.m_data.object,0x8000,0x8000,0,0,0,0,0,2,&textureLevel);
    local_400 = caseDef->numLayers;
    uStack_420 = (DeviceInterface *)((ulong)local_400 << 0x20);
    vertexBufferOffset = 1;
    local_418._M_allocated_capacity = 0;
    local_418._8_4_ = 0;
    local_418._12_4_ = 1;
    uStack_408 = 0;
    uStack_404 = 0;
    uStack_3fc = 0;
    local_3f8 = 0;
    iStack_3f4 = 0;
    uStack_3f0 = *(undefined8 *)(caseDef->attachmentSize).m_data;
    local_3e8 = (caseDef->attachmentSize).m_data[2];
    (*vk->_vptr_DeviceInterface[0x69])
              (vk,local_328.m_data.object,
               msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1
               ,colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,1,
               1,(int)&vertexBufferOffset);
    uVar12 = (uint)caseDef->multisample;
  }
  else {
    uVar12 = 0;
  }
  textureLevel.m_format.order = 0x2d;
  textureLevel.m_size.m_data[0] = 0;
  textureLevel.m_size.m_data[1] = 0;
  textureLevel.m_size.m_data[2] = 0x100;
  if ((uVar12 & 1) != 0) {
    textureLevel.m_size.m_data[2] = 0x1000;
  }
  textureLevel._20_4_ = 0x800;
  textureLevel.m_data.m_ptr._0_4_ = 2 - (uVar12 & 1);
  textureLevel.m_data.m_ptr._4_4_ = 6;
  textureLevel.m_data.m_cap._0_4_ = 0xffffffff;
  textureLevel.m_data.m_cap._4_4_ = 0xffffffff;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_328.m_data.object,0x400,0x1000,0,0,0,0,0,1,&textureLevel);
  vertexBufferOffset = 0;
  uStack_420 = (DeviceInterface *)0x0;
  local_418._12_4_ = caseDef->numLayers;
  local_418._8_4_ = 0;
  local_418._M_allocated_capacity = 1;
  uStack_408 = 0;
  uStack_404 = 0;
  local_400 = 0;
  uVar5 = *(undefined8 *)(caseDef->attachmentSize).m_data;
  iStack_3f4 = (caseDef->attachmentSize).m_data[2];
  uStack_3fc = (undefined4)uVar5;
  local_3f8 = (undefined4)((ulong)uVar5 >> 0x20);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_328.m_data.object,
             colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,
             local_128.m_data.object.m_internal,1,(int)&vertexBufferOffset);
  pVVar8 = local_3c0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(attachmentDescriptions.
                         super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000001000;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_328.m_data.object,0x1000,0x4000,0,0,0,1,(int)&attachmentDescriptions,0,0);
  result = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_328.m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                    ,0x310);
  submitCommandsAndWait(vk,pVVar8,queue,local_328.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,pVVar8,
             (VkDeviceMemory)
             ((colorBufferAlloc.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_offset,0xffffffffffffffff);
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  dVar15 = (caseDef->attachmentSize).m_data[2];
  dVar6 = caseDef->numLayers;
  if ((int)caseDef->numLayers < (int)dVar15) {
    dVar6 = dVar15;
  }
  tcu::TextureLevel::TextureLevel
            (&textureLevel,&format,(caseDef->attachmentSize).m_data[0],
             (caseDef->attachmentSize).m_data[1],dVar6);
  local_3d8 = (IVec3 *)CONCAT44(local_3d8._4_4_,dVar6);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&vertexBufferOffset,&textureLevel);
  dVar15 = (caseDef->renderSize).m_data[2];
  dVar6 = caseDef->numLayers;
  if ((int)caseDef->numLayers < (int)dVar15) {
    dVar6 = dVar15;
  }
  for (iVar13 = 0; iVar13 < (int)local_418._M_allocated_capacity._0_4_; iVar13 = iVar13 + 1) {
    for (iVar16 = 0; iVar16 < uStack_420._4_4_; iVar16 = iVar16 + 1) {
      for (iVar18 = 0; iVar18 < (int)uStack_420; iVar18 = iVar18 + 1) {
        if (((iVar18 < local_3c8->m_data[0]) && (iVar13 < (int)dVar6)) &&
           (iVar16 < (caseDef->renderSize).m_data[1])) {
          attachmentDescriptions.
          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f800000;
          attachmentDescriptions.
          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003e800000;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&vertexBufferOffset,(Vec4 *)&attachmentDescriptions,iVar18
                     ,iVar16,iVar13);
        }
        else {
          attachmentDescriptions.
          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          attachmentDescriptions.
          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&vertexBufferOffset,(Vec4 *)&attachmentDescriptions,iVar18
                     ,iVar16,iVar13);
        }
      }
    }
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&attachmentDescriptions,&format,
             (caseDef->attachmentSize).m_data[0],(caseDef->attachmentSize).m_data[1],
             (VkPrimitiveTopology)local_3d8,
             (colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
              .m_data.ptr)->m_hostPtr);
  log = context->m_testCtx->m_log;
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&clearColor,1);
  bVar19 = tcu::intThresholdCompare
                     (log,"Image Comparison","",(ConstPixelBufferAccess *)&vertexBufferOffset,
                      (ConstPixelBufferAccess *)&attachmentDescriptions,(UVec4 *)&clearColor,
                      COMPARE_LOG_RESULT);
  if (bVar19) {
    tcu::TextureLevel::~TextureLevel(&textureLevel);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&textureLevel,"Pass",(allocator<char> *)&vertexBufferOffset);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&textureLevel);
    std::__cxx11::string::~string((string *)&textureLevel);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&clearColor,"Fail",&local_3c9);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&clearColor);
    std::__cxx11::string::~string((string *)&clearColor);
    tcu::TextureLevel::~TextureLevel(&textureLevel);
  }
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_328);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_98);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&subpasses);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_148);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipeline);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_78);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~_Vector_base(&attachmentHandles.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               );
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector(&colorAttachments);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&vertexBufferAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&colorBufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
            );
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_128);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&msColorImageAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&msColorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&colorImageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>)
  ;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&colorImage.super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&						allocator			= context.getDefaultAllocator();

	// Color image for rendering in single-sample tests or resolve target for multi-sample tests
	Move<VkImage>					colorImage;
	MovePtr<Allocation>				colorImageAlloc;

	// For multisampled tests, this is the rendering target
	Move<VkImage>					msColorImage;
	MovePtr<Allocation>				msColorImageAlloc;

	// Host memory buffer where we will copy the rendered image for verification
	const deUint32					att_size_x			= caseDef.attachmentSize.x();
	const deUint32					att_size_y			= caseDef.attachmentSize.y();
	const deUint32					att_size_z			= caseDef.attachmentSize.z();
	const VkDeviceSize				colorBufferSize		= att_size_x * att_size_y * att_size_z * caseDef.numLayers * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>			colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>		colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	Move<VkBuffer>					vertexBuffer;
	MovePtr<Allocation>				vertexBufferAlloc;

	vector<SharedPtrVkImageView>	colorAttachments;
	vector<VkImageView>				attachmentHandles;

	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device));
	vector<SharedPtrVkPipeline>		pipeline;
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, COLOR_FORMAT, caseDef.numLayers, caseDef.multisample));
	Move<VkFramebuffer>				framebuffer;

	const Unique<VkShaderModule>	vertexModule		(createShaderModule(vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>	fragmentModule		(createShaderModule(vk, device, context.getBinaryCollection().get("frag"), 0u));

	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));

	const VkImageViewType			imageViewType		= caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE || caseDef.imageType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY
		? VK_IMAGE_VIEW_TYPE_2D : caseDef.imageType;

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genFullQuadVertices(caseDef.numLayers);
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);

		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// create colorImage (and msColorImage) using the configured attachmentsize
	{
		const VkImageUsageFlags	colorImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;

		colorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
			caseDef.attachmentSize, caseDef.numLayers, colorImageUsage, false);
		colorImageAlloc	= bindImage(vk, device, allocator, *colorImage, MemoryRequirement::Any);

		if (caseDef.multisample)
		{
			const VkImageUsageFlags	msImageUsage	= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

			msColorImage		= makeImage(vk, device, VkImageViewCreateFlags(0), getImageType(caseDef.imageType), COLOR_FORMAT,
				caseDef.attachmentSize, caseDef.numLayers, msImageUsage, true);
			msColorImageAlloc	= bindImage(vk, device, allocator, *msColorImage, MemoryRequirement::Any);
		}
	}

	// create attachmentHandles and pipelines (one for each layer). We use the renderSize for viewport and scissor
	for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
	{
		colorAttachments.push_back(makeSharedPtr(makeImageView(vk, device, ! caseDef.multisample ? *colorImage : *msColorImage,
			imageViewType, COLOR_FORMAT, makeColorSubresourceRange(layerNdx, 1))));
		attachmentHandles.push_back(**colorAttachments.back());

		pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
			caseDef.renderSize, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, layerNdx, true, caseDef.multisample)));
	}

	// create framebuffer
	framebuffer = makeFramebuffer(vk, device, *renderPass, caseDef.numLayers, &attachmentHandles[0],
		static_cast<deUint32>(caseDef.renderSize.x()), static_cast<deUint32>(caseDef.renderSize.y()));

	// record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// Clear the entire image attachment to black
		{
			const VkImageMemoryBarrier	imageLayoutBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					0u,													// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageLayoutBarriers);

			const VkImageSubresourceRange	ranges		= makeColorSubresourceRange(0, caseDef.numLayers);
			const VkClearColorValue			clearColor	=
	        {
                {0.0f, 0.0f, 0.0f, 1.0f}
			};
			vk.cmdClearColorImage(*cmdBuffer, caseDef.multisample ? *msColorImage : *colorImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, &clearColor, 1u, &ranges);

			const VkImageMemoryBarrier	imageClearBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
					DE_NULL,											// const void*				pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags			srcAccessMask;
					VK_ACCESS_COLOR_ATTACHMENT_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,				// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,							// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,							// deUint32					destQueueFamilyIndex;
					caseDef.multisample ? *msColorImage : *colorImage,	// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)		// VkImageSubresourceRange	subresourceRange;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageClearBarriers);
		}

		// Render pass: this should render only to the area defined by renderSize (smaller than the size of the attachment)
		{
			const VkRect2D				renderArea			=
			{
				makeOffset2D(0, 0),
				makeExtent2D(caseDef.renderSize.x(), caseDef.renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize			vertexBufferOffset	= 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
			{
				vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				for (deUint32 layerNdx = 0; layerNdx < caseDef.numLayers; ++layerNdx)
				{
					if (layerNdx != 0)
						vk.cmdNextSubpass(*cmdBuffer, VK_SUBPASS_CONTENTS_INLINE);

					vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[layerNdx]);
					vk.cmdDraw(*cmdBuffer, 4u, 1u, layerNdx*4u, 0u);
				}
			}
			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// If we are using a multi-sampled render target (msColorImage), resolve it now (to colorImage)
		if (caseDef.multisample)
		{
			// Transition msColorImage (from layout COLOR_ATTACHMENT_OPTIMAL) and colorImage (from layout UNDEFINED) to layout GENERAL before resolving
			const VkImageMemoryBarrier	imageBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,			// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*msColorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				},
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
					DE_NULL,										// const void*				pNext;
					(VkAccessFlags)0,								// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_GENERAL,						// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,						// deUint32					destQueueFamilyIndex;
					*colorImage,									// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)	// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 2u, imageBarriers);

			const VkImageResolve	region	=
			{
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    srcSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  srcOffset;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0, 0, caseDef.numLayers),	// VkImageSubresourceLayers    dstSubresource;
				makeOffset3D(0, 0, 0),															// VkOffset3D                  dstOffset;
				makeExtent3D(caseDef.attachmentSize)											// VkExtent3D                  extent;
			};

			vk.cmdResolveImage(*cmdBuffer, *msColorImage, VK_IMAGE_LAYOUT_GENERAL, *colorImage, VK_IMAGE_LAYOUT_GENERAL, 1, &region);
		}

		// copy colorImage to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,														// VkStructureType			sType;
					DE_NULL,																					// const void*				pNext;
					(vk::VkAccessFlags)(caseDef.multisample ? VK_ACCESS_TRANSFER_WRITE_BIT : VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),
					VK_ACCESS_TRANSFER_READ_BIT,																// VkAccessFlags			dstAccessMask;
					caseDef.multisample ? VK_IMAGE_LAYOUT_GENERAL : VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,														// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,																	// deUint32					destQueueFamilyIndex;
					*colorImage,																				// VkImage					image;
					makeColorSubresourceRange(0, caseDef.numLayers)												// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																				// VkDeviceSize                bufferOffset;
				0u,																					// uint32_t                    bufferRowLength;
				0u,																					// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, caseDef.numLayers),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),																// VkOffset3D                  imageOffset;
				makeExtent3D(caseDef.attachmentSize),												// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		const int							depth			= deMax32(caseDef.attachmentSize.z(), caseDef.numLayers);
		tcu::TextureLevel					textureLevel	(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedData(textureLevel, caseDef);
		const tcu::ConstPixelBufferAccess	resultImage		(format, caseDef.attachmentSize.x(), caseDef.attachmentSize.y(), depth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}